

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftpdir.c
# Opt level: O2

int main(int argc,char **argv)

{
  byte bVar1;
  in_addr_t iVar2;
  uint uVar3;
  int __fd;
  int iVar4;
  long lVar5;
  long lVar6;
  size_t sVar7;
  char *pcVar8;
  size_t sVar9;
  byte bVar10;
  long lVar11;
  char *pcVar12;
  bool bVar13;
  size_t sStack_4a0;
  LIBSSH2_SFTP_ATTRIBUTES attrs;
  sockaddr_in sin;
  char longentry [512];
  char mem [512];
  
  iVar2 = 0x100007f;
  if ((1 < argc) && (iVar2 = inet_addr(argv[1]), argc != 2)) {
    username = argv[2];
    if ((3 < (uint)argc) && (password = argv[3], argc != 4)) {
      sftppath = argv[4];
    }
  }
  uVar3 = libssh2_init(0);
  if (uVar3 != 0) {
    fprintf(_stderr,"libssh2 initialization failed (%d)\n",(ulong)uVar3);
    return 1;
  }
  __fd = socket(2,1,0);
  if (__fd == -1) {
    fwrite("failed to create socket!\n",0x19,1,_stderr);
    goto LAB_001018d8;
  }
  sin.sin_family = 2;
  sin.sin_port = 0x1600;
  sin.sin_addr.s_addr = iVar2;
  iVar4 = connect(__fd,(sockaddr *)&sin,0x10);
  if (iVar4 == 0) {
    lVar5 = libssh2_session_init_ex(0,0,0,0);
    if (lVar5 == 0) {
      pcVar12 = "Could not initialize SSH session!\n";
      sStack_4a0 = 0x22;
      goto LAB_00101423;
    }
    uVar3 = libssh2_session_handshake(lVar5,__fd);
    if (uVar3 == 0) {
      lVar6 = libssh2_hostkey_hash(lVar5,2);
      fwrite("Fingerprint: ",0xd,1,_stderr);
      for (lVar11 = 0; lVar11 != 0x14; lVar11 = lVar11 + 1) {
        fprintf(_stderr,"%02X ",(ulong)*(byte *)(lVar6 + lVar11));
      }
      fputc(10,_stderr);
      pcVar12 = username;
      sVar7 = strlen(username);
      pcVar12 = (char *)libssh2_userauth_list(lVar5,pcVar12,sVar7 & 0xffffffff);
      if (pcVar12 == (char *)0x0) {
LAB_001014f2:
        fwrite("libssh2_sftp_init()!\n",0x15,1,_stderr);
        lVar6 = libssh2_sftp_init(lVar5);
        if (lVar6 == 0) {
          pcVar12 = "Unable to init SFTP session\n";
          sStack_4a0 = 0x1c;
        }
        else {
          libssh2_session_set_blocking(lVar5,1);
          fwrite("libssh2_sftp_opendir()!\n",0x18,1,_stderr);
          pcVar12 = sftppath;
          sVar7 = strlen(sftppath);
          lVar11 = libssh2_sftp_open_ex(lVar6,pcVar12,sVar7 & 0xffffffff,0,0,1);
          if (lVar11 != 0) {
            fwrite("libssh2_sftp_opendir() is done, now receive listing!\n",0x35,1,_stderr);
            while (iVar4 = libssh2_sftp_readdir_ex(lVar11,mem,0x200,longentry,0x200,&attrs),
                  0 < iVar4) {
              pcVar12 = longentry;
              if (longentry[0] == '\0') {
                pcVar12 = "--fix----- ";
                if (((byte)attrs.flags & 4) == 0) {
                  pcVar12 = "---------- ";
                }
                printf(pcVar12);
                if (((byte)attrs.flags & 2) == 0) {
                  printf("   -    - ");
                }
                else {
                  printf("%4d %4d ",(ulong)(uint)attrs.uid,(ulong)(uint)attrs.gid);
                }
                pcVar12 = mem;
                if (((byte)attrs.flags & 1) != 0) {
                  printf("%8llu ",attrs.filesize);
                }
              }
              puts(pcVar12);
            }
            libssh2_sftp_close_handle(lVar11);
            libssh2_sftp_shutdown(lVar6);
            goto LAB_001018a6;
          }
          pcVar12 = "Unable to open dir with SFTP\n";
          sStack_4a0 = 0x1d;
        }
      }
      else {
        fprintf(_stderr,"Authentication methods: %s\n",pcVar12);
        pcVar8 = strstr(pcVar12,"password");
        bVar13 = pcVar8 != (char *)0x0;
        pcVar8 = strstr(pcVar12,"keyboard-interactive");
        bVar1 = bVar13 + 2;
        if (pcVar8 == (char *)0x0) {
          bVar1 = bVar13;
        }
        pcVar8 = strstr(pcVar12,"publickey");
        pcVar12 = username;
        bVar10 = bVar1 + 4;
        if (pcVar8 == (char *)0x0) {
          bVar10 = bVar1;
        }
        if (5 < argc) {
          if ((((bVar13) && (pcVar8 = argv[5], *pcVar8 == '-')) && (pcVar8[1] == 'p')) &&
             (pcVar8[2] == '\0')) {
            bVar10 = 0;
            bVar13 = true;
          }
          if ((((bVar10 & 2) != 0) && (pcVar8 = argv[5], *pcVar8 == '-')) &&
             ((pcVar8[1] == 'i' && (pcVar8[2] == '\0')))) {
            bVar10 = 2;
            bVar13 = false;
          }
          if ((((bVar10 & 4) != 0) && (pcVar8 = argv[5], *pcVar8 == '-')) &&
             ((pcVar8[1] == 'k' && (pcVar8[2] == '\0')))) {
            bVar10 = 4;
            bVar13 = false;
          }
        }
        if (!bVar13) {
          if ((bVar10 & 2) == 0) {
            if ((bVar10 & 4) == 0) {
              pcVar12 = "No supported authentication methods found!\n";
              sStack_4a0 = 0x2b;
            }
            else {
              sVar7 = strlen(username);
              iVar4 = libssh2_userauth_publickey_fromfile_ex
                                (lVar5,pcVar12,sVar7 & 0xffffffff,"/home/username/.ssh/id_rsa.pub",
                                 "/home/username/.ssh/id_rsa",password);
              if (iVar4 == 0) {
                pcVar12 = "Authentication by public key succeeded.\n";
                sStack_4a0 = 0x28;
                goto LAB_0010187b;
              }
              pcVar12 = "Authentication by public key failed!\n";
              sStack_4a0 = 0x25;
            }
          }
          else {
            sVar7 = strlen(username);
            iVar4 = libssh2_userauth_keyboard_interactive_ex
                              (lVar5,pcVar12,sVar7 & 0xffffffff,kbd_callback);
            if (iVar4 == 0) {
              pcVar12 = "Authentication by keyboard-interactive succeeded.\n";
              sStack_4a0 = 0x32;
LAB_0010187b:
              fwrite(pcVar12,sStack_4a0,1,_stderr);
              goto LAB_001014f2;
            }
            pcVar12 = "Authentication by keyboard-interactive failed!\n";
            sStack_4a0 = 0x2f;
          }
          fwrite(pcVar12,sStack_4a0,1,_stderr);
          goto LAB_001018a6;
        }
        sVar7 = strlen(username);
        pcVar8 = password;
        sVar9 = strlen(password);
        iVar4 = libssh2_userauth_password_ex
                          (lVar5,pcVar12,sVar7 & 0xffffffff,pcVar8,sVar9 & 0xffffffff,0);
        if (iVar4 == 0) goto LAB_001014f2;
        pcVar12 = "Authentication by password failed!\n";
        sStack_4a0 = 0x23;
      }
      fwrite(pcVar12,sStack_4a0,1,_stderr);
    }
    else {
      fprintf(_stderr,"Failure establishing SSH session: %d\n",(ulong)uVar3);
    }
LAB_001018a6:
    libssh2_session_disconnect_ex(lVar5,0xb,"Normal Shutdown","");
    libssh2_session_free(lVar5);
  }
  else {
    pcVar12 = "failed to connect!\n";
    sStack_4a0 = 0x13;
LAB_00101423:
    fwrite(pcVar12,sStack_4a0,1,_stderr);
  }
  shutdown(__fd,2);
  close(__fd);
LAB_001018d8:
  fwrite("all done\n",9,1,_stderr);
  libssh2_exit();
  return 0;
}

Assistant:

int main(int argc, char *argv[])
{
    uint32_t hostaddr;
    libssh2_socket_t sock;
    int i, auth_pw = 0;
    struct sockaddr_in sin;
    const char *fingerprint;
    char *userauthlist;
    int rc;
    LIBSSH2_SESSION *session = NULL;
    LIBSSH2_SFTP *sftp_session;
    LIBSSH2_SFTP_HANDLE *sftp_handle;

#ifdef WIN32
    WSADATA wsadata;

    rc = WSAStartup(MAKEWORD(2, 0), &wsadata);
    if(rc) {
        fprintf(stderr, "WSAStartup failed with error: %d\n", rc);
        return 1;
    }
#endif

    if(argc > 1) {
        hostaddr = inet_addr(argv[1]);
    }
    else {
        hostaddr = htonl(0x7F000001);
    }
    if(argc > 2) {
        username = argv[2];
    }
    if(argc > 3) {
        password = argv[3];
    }
    if(argc > 4) {
        sftppath = argv[4];
    }

    rc = libssh2_init(0);
    if(rc) {
        fprintf(stderr, "libssh2 initialization failed (%d)\n", rc);
        return 1;
    }

    /*
     * The application code is responsible for creating the socket
     * and establishing the connection
     */
    sock = socket(AF_INET, SOCK_STREAM, 0);
    if(sock == LIBSSH2_INVALID_SOCKET) {
        fprintf(stderr, "failed to create socket!\n");
        goto shutdown;
    }

    sin.sin_family = AF_INET;
    sin.sin_port = htons(22);
    sin.sin_addr.s_addr = hostaddr;
    if(connect(sock, (struct sockaddr*)(&sin), sizeof(struct sockaddr_in))) {
        fprintf(stderr, "failed to connect!\n");
        goto shutdown;
    }

    /* Create a session instance */
    session = libssh2_session_init();
    if(!session) {
        fprintf(stderr, "Could not initialize SSH session!\n");
        goto shutdown;
    }

    /* ... start it up. This will trade welcome banners, exchange keys,
     * and setup crypto, compression, and MAC layers
     */
    rc = libssh2_session_handshake(session, sock);
    if(rc) {
        fprintf(stderr, "Failure establishing SSH session: %d\n", rc);
        goto shutdown;
    }

    /* At this point we have not yet authenticated.  The first thing to do
     * is check the hostkey's fingerprint against our known hosts Your app
     * may have it hard coded, may go to a file, may present it to the
     * user, that's your call
     */
    fingerprint = libssh2_hostkey_hash(session, LIBSSH2_HOSTKEY_HASH_SHA1);
    fprintf(stderr, "Fingerprint: ");
    for(i = 0; i < 20; i++) {
        fprintf(stderr, "%02X ", (unsigned char)fingerprint[i]);
    }
    fprintf(stderr, "\n");

    /* check what authentication methods are available */
    userauthlist = libssh2_userauth_list(session, username,
                                         (unsigned int)strlen(username));
    if(userauthlist) {
        fprintf(stderr, "Authentication methods: %s\n", userauthlist);
        if(strstr(userauthlist, "password")) {
            auth_pw |= 1;
        }
        if(strstr(userauthlist, "keyboard-interactive")) {
            auth_pw |= 2;
        }
        if(strstr(userauthlist, "publickey")) {
            auth_pw |= 4;
        }

        /* check for options */
        if(argc > 5) {
            if((auth_pw & 1) && !strcmp(argv[5], "-p")) {
                auth_pw = 1;
            }
            if((auth_pw & 2) && !strcmp(argv[5], "-i")) {
                auth_pw = 2;
            }
            if((auth_pw & 4) && !strcmp(argv[5], "-k")) {
                auth_pw = 4;
            }
        }

        if(auth_pw & 1) {
            /* We could authenticate via password */
            if(libssh2_userauth_password(session, username, password)) {
                fprintf(stderr, "Authentication by password failed!\n");
                goto shutdown;
            }
        }
        else if(auth_pw & 2) {
            /* Or via keyboard-interactive */
            if(libssh2_userauth_keyboard_interactive(session, username,
                                                     &kbd_callback) ) {
                fprintf(stderr,
                        "Authentication by keyboard-interactive failed!\n");
                goto shutdown;
            }
            else {
                fprintf(stderr,
                        "Authentication by keyboard-interactive succeeded.\n");
            }
        }
        else if(auth_pw & 4) {
            /* Or by public key */
            if(libssh2_userauth_publickey_fromfile(session, username,
                                                   pubkey, privkey,
                                                   password)) {
                fprintf(stderr, "Authentication by public key failed!\n");
                goto shutdown;
            }
            else {
                fprintf(stderr, "Authentication by public key succeeded.\n");
            }
        }
        else {
            fprintf(stderr, "No supported authentication methods found!\n");
            goto shutdown;
        }
    }

    fprintf(stderr, "libssh2_sftp_init()!\n");
    sftp_session = libssh2_sftp_init(session);

    if(!sftp_session) {
        fprintf(stderr, "Unable to init SFTP session\n");
        goto shutdown;
    }

    /* Since we have not set non-blocking, tell libssh2 we are blocking */
    libssh2_session_set_blocking(session, 1);

    fprintf(stderr, "libssh2_sftp_opendir()!\n");
    /* Request a dir listing via SFTP */
    sftp_handle = libssh2_sftp_opendir(sftp_session, sftppath);
    if(!sftp_handle) {
        fprintf(stderr, "Unable to open dir with SFTP\n");
        goto shutdown;
    }

    fprintf(stderr, "libssh2_sftp_opendir() is done, now receive listing!\n");
    do {
        char mem[512];
        char longentry[512];
        LIBSSH2_SFTP_ATTRIBUTES attrs;

        /* loop until we fail */
        rc = libssh2_sftp_readdir_ex(sftp_handle, mem, sizeof(mem),
                                     longentry, sizeof(longentry), &attrs);
        if(rc > 0) {
            /* rc is the length of the file name in the mem
               buffer */

            if(longentry[0] != '\0') {
                printf("%s\n", longentry);
            }
            else {
                if(attrs.flags & LIBSSH2_SFTP_ATTR_PERMISSIONS) {
                    /* this should check what permissions it
                       is and print the output accordingly */
                    printf("--fix----- ");
                }
                else {
                    printf("---------- ");
                }

                if(attrs.flags & LIBSSH2_SFTP_ATTR_UIDGID) {
                    printf("%4d %4d ", (int) attrs.uid, (int) attrs.gid);
                }
                else {
                    printf("   -    - ");
                }

                if(attrs.flags & LIBSSH2_SFTP_ATTR_SIZE) {
                    printf("%8" __FILESIZE " ", attrs.filesize);
                }

                printf("%s\n", mem);
            }
        }
        else {
            break;
        }

    } while(1);

    libssh2_sftp_closedir(sftp_handle);
    libssh2_sftp_shutdown(sftp_session);

shutdown:

    if(session) {
        libssh2_session_disconnect(session, "Normal Shutdown");
        libssh2_session_free(session);
    }

    if(sock != LIBSSH2_INVALID_SOCKET) {
        shutdown(sock, 2);
#ifdef WIN32
        closesocket(sock);
#else
        close(sock);
#endif
    }

    fprintf(stderr, "all done\n");

    libssh2_exit();

    return 0;
}